

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SecurityDirWrapper.cpp
# Opt level: O1

QString * __thiscall
SecurityDirWrapper::translateType(QString *__return_storage_ptr__,SecurityDirWrapper *this,int type)

{
  storage_type *psVar1;
  QByteArrayView QVar2;
  QByteArrayView QVar3;
  Data *local_30;
  char16_t *local_28;
  qsizetype local_20;
  
  switch(type) {
  case 1:
    psVar1 = (storage_type *)0x11;
    break;
  case 2:
    psVar1 = (storage_type *)0x10;
    break;
  case 3:
    psVar1 = (storage_type *)0x8;
    break;
  default:
    QVar3.m_data = (storage_type *)0x0;
    QVar3.m_size = (qsizetype)&local_30;
    QString::fromUtf8(QVar3);
    (__return_storage_ptr__->d).size = 0;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).d = local_30;
    goto LAB_00134e8a;
  case 9:
    psVar1 = (storage_type *)0x18;
  }
  QVar2.m_data = psVar1;
  QVar2.m_size = (qsizetype)&local_30;
  QString::fromUtf8(QVar2);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = local_30;
LAB_00134e8a:
  (__return_storage_ptr__->d).ptr = local_28;
  (__return_storage_ptr__->d).size = local_20;
  return __return_storage_ptr__;
}

Assistant:

QString SecurityDirWrapper::translateType(int type)
{
    switch (type) {
        case pe::WIN_CERT_TYPE_X509  : return "X.509 certificate";
        case pe::WIN_CERT_TYPE_PKCS_SIGNED_DATA : return "PKCS Signed Data";
        case pe::WIN_CERT_TYPE_RESERVED_1 : return "Reserved";
        case pe::WIN_CERT_TYPE_PKCS1_SIGN : return "PKCS1 Module Sign Fields";
    }
    return "";
}